

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateInfoSetLocalPort(HelicsFederateInfo fedInfo,char *localPort,HelicsError *err)

{
  FederateInfo *pFVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pFVar1 = getFedInfo(fedInfo,err);
  if (pFVar1 != (FederateInfo *)0x0) {
    if (localPort == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_30,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,localPort,&local_31);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pFVar1->localport,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void helicsFederateInfoSetLocalPort(HelicsFederateInfo fedInfo, const char* localPort, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    info->localport = AS_STRING(localPort);
}